

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

int32_t ucurr_countCurrencies_63(char *locale,UDate date,UErrorCode *ec)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  UResourceBundle *resB;
  int32_t *piVar4;
  UDate toDate;
  int32_t *toArray;
  UResourceBundle *toRes;
  double dStack_130;
  int32_t toLength;
  UDate fromDate;
  int64_t currDate64;
  int32_t *fromArray;
  UResourceBundle *fromRes;
  UResourceBundle *pUStack_108;
  int32_t fromLength;
  UResourceBundle *currencyRes;
  UResourceBundle *pUStack_f8;
  int32_t i;
  UResourceBundle *countryArray;
  UResourceBundle *cm;
  UResourceBundle *rb;
  char *idDelim;
  char id [157];
  UErrorCode local_30;
  int local_2c;
  UErrorCode localStatus;
  int32_t currCount;
  UErrorCode *ec_local;
  UDate date_local;
  char *locale_local;
  
  local_2c = 0;
  if ((ec != (UErrorCode *)0x0) &&
     (_localStatus = ec, ec_local = (UErrorCode *)date, date_local = (UDate)locale,
     UVar2 = U_SUCCESS(*ec), UVar2 != '\0')) {
    local_30 = U_ZERO_ERROR;
    uloc_getKeywordValue_63((char *)date_local,"currency",(char *)&idDelim,0x9d,&local_30);
    idForLocale((char *)date_local,(char *)&idDelim,0x9d,_localStatus);
    UVar2 = U_FAILURE(*_localStatus);
    if (UVar2 != '\0') {
      return 0;
    }
    rb = (UResourceBundle *)strchr((char *)&idDelim,0x5f);
    if (rb != (UResourceBundle *)0x0) {
      *(char *)&rb->fKey = '\0';
    }
    cm = ures_openDirect_63("icudt63l-curr","supplementalData",&local_30);
    countryArray = ures_getByKey_63(cm,"CurrencyMap",cm,&local_30);
    pUStack_f8 = ures_getByKey_63(cm,(char *)&idDelim,countryArray,&local_30);
    UVar2 = U_SUCCESS(local_30);
    if (UVar2 != '\0') {
      for (currencyRes._4_4_ = 0; iVar1 = currencyRes._4_4_, iVar3 = ures_getSize_63(pUStack_f8),
          iVar1 < iVar3; currencyRes._4_4_ = currencyRes._4_4_ + 1) {
        pUStack_108 = ures_getByIndex_63(pUStack_f8,currencyRes._4_4_,(UResourceBundle *)0x0,
                                         &local_30);
        fromRes._4_4_ = 0;
        fromArray = (int32_t *)ures_getByKey_63(pUStack_108,"from",(UResourceBundle *)0x0,&local_30)
        ;
        currDate64 = (int64_t)ures_getIntVector_63
                                        ((UResourceBundle *)fromArray,
                                         (int32_t *)((long)&fromRes + 4),&local_30);
        fromDate = (UDate)CONCAT44(*(int32_t *)currDate64,*(int32_t *)(currDate64 + 4));
        dStack_130 = (double)(long)fromDate;
        iVar3 = ures_getSize_63(pUStack_108);
        if (iVar3 < 3) {
          if (dStack_130 <= (double)ec_local) {
            local_2c = local_2c + 1;
          }
        }
        else {
          toRes._4_4_ = 0;
          resB = ures_getByKey_63(pUStack_108,"to",(UResourceBundle *)0x0,&local_30);
          piVar4 = ures_getIntVector_63(resB,(int32_t *)((long)&toRes + 4),&local_30);
          fromDate = (UDate)CONCAT44(*piVar4,piVar4[1]);
          if ((dStack_130 <= (double)ec_local) && ((double)ec_local < (double)(long)fromDate)) {
            local_2c = local_2c + 1;
          }
          ures_close_63(resB);
        }
        ures_close_63(pUStack_108);
        ures_close_63((UResourceBundle *)fromArray);
      }
    }
    ures_close_63(pUStack_f8);
    if ((*_localStatus == U_ZERO_ERROR) || (local_30 != U_ZERO_ERROR)) {
      *_localStatus = local_30;
    }
    UVar2 = U_SUCCESS(*_localStatus);
    if (UVar2 != '\0') {
      return local_2c;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucurr_countCurrencies(const char* locale, 
                 UDate date, 
                 UErrorCode* ec)
{
    int32_t currCount = 0;

    if (ec != NULL && U_SUCCESS(*ec)) 
    {
        // local variables
        UErrorCode localStatus = U_ZERO_ERROR;
        char id[ULOC_FULLNAME_CAPACITY];
        uloc_getKeywordValue(locale, "currency", id, ULOC_FULLNAME_CAPACITY, &localStatus);

        // get country or country_variant in `id'
        /*uint32_t variantType =*/ idForLocale(locale, id, sizeof(id), ec);

        if (U_FAILURE(*ec))
        {
            return 0;
        }

        // Remove variants, which is only needed for registration.
        char *idDelim = strchr(id, VAR_DELIM);
        if (idDelim)
        {
            idDelim[0] = 0;
        }

        // Look up the CurrencyMap element in the root bundle.
        UResourceBundle *rb = ures_openDirect(U_ICUDATA_CURR, CURRENCY_DATA, &localStatus);
        UResourceBundle *cm = ures_getByKey(rb, CURRENCY_MAP, rb, &localStatus);

        // Using the id derived from the local, get the currency data
        UResourceBundle *countryArray = ures_getByKey(rb, id, cm, &localStatus);

        // process each currency to see which one is valid for the given date
        if (U_SUCCESS(localStatus))
        {
            for (int32_t i=0; i<ures_getSize(countryArray); i++)
            {
                // get the currency resource
                UResourceBundle *currencyRes = ures_getByIndex(countryArray, i, NULL, &localStatus);

                // get the from date
                int32_t fromLength = 0;
                UResourceBundle *fromRes = ures_getByKey(currencyRes, "from", NULL, &localStatus);
                const int32_t *fromArray = ures_getIntVector(fromRes, &fromLength, &localStatus);

                int64_t currDate64 = (int64_t)fromArray[0] << 32;
                currDate64 |= ((int64_t)fromArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                UDate fromDate = (UDate)currDate64;

                if (ures_getSize(currencyRes)> 2)
                {
                    int32_t toLength = 0;
                    UResourceBundle *toRes = ures_getByKey(currencyRes, "to", NULL, &localStatus);
                    const int32_t *toArray = ures_getIntVector(toRes, &toLength, &localStatus);

                    currDate64 = (int64_t)toArray[0] << 32;
                    currDate64 |= ((int64_t)toArray[1] & (int64_t)INT64_C(0x00000000FFFFFFFF));
                    UDate toDate = (UDate)currDate64;

                    if ((fromDate <= date) && (date < toDate))
                    {
                        currCount++;
                    }

                    ures_close(toRes);
                }
                else
                {
                    if (fromDate <= date)
                    {
                        currCount++;
                    }
                }

                // close open resources
                ures_close(currencyRes);
                ures_close(fromRes);

            } // end For loop
        } // end if (U_SUCCESS(localStatus))

        ures_close(countryArray);

        // Check for errors
        if (*ec == U_ZERO_ERROR || localStatus != U_ZERO_ERROR)
        {
            // There is nothing to fallback to. 
            // Report the failure/warning if possible.
            *ec = localStatus;
        }

        if (U_SUCCESS(*ec))
        {
            // no errors
            return currCount;
        }

    }

    // If we got here, either error code is invalid or
    // some argument passed is no good.
    return 0;
}